

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitStringTest_random_Test<char8_t>::TestBody(SplitStringTest_random_Test<char8_t> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c0 [8];
  Message local_b8 [8];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  split_result;
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  data;
  SplitStringTest_random_Test<char8_t> *this_local;
  
  data.m_tokens.
  super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::RandomTestData((RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                    *)&split_result.
                       super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,'\0',0,0);
  jessilib::
  split<std::vector,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
            ((container_type_conflict3 *)local_90,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             &data.m_fixed_word_length,'\0');
  testing::internal::EqHelper::
  Compare<std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((EqHelper *)local_b0,"split_result","data.m_tokens",
             (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)local_90,
             (vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)((long)&data.m_str.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xe2,pcVar2);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)local_90);
  RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
  ::~RandomTestData((RandomTestData<char8_t,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>
                     *)&split_result.
                        super__Vector_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random) {
	RandomTestData<TypeParam> data{};
	std::vector<std::basic_string<TypeParam>> split_result = split(data.m_str, default_delim<TypeParam>);
	EXPECT_EQ(split_result, data.m_tokens);
}